

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_debug_scaling_list
               (bs_t *b,int *scalingList,int sizeOfScalingList,int *useDefaultScalingMatrixFlag)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  FILE *pFVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  
  if (0 < sizeOfScalingList) {
    iVar12 = 8;
    uVar5 = 0;
    iVar3 = 8;
    do {
      bVar13 = iVar3 != 0;
      iVar3 = 0;
      if (bVar13) {
        pFVar8 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar8 = _stdout;
        }
        fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar7 = b->p;
        pbVar1 = b->end;
        uVar9 = b->bits_left;
        uVar2 = 0xffffffff;
        iVar3 = -2;
        do {
          iVar6 = iVar3;
          uVar4 = uVar2;
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          bVar13 = true;
          if (pbVar7 < pbVar1) {
            bVar13 = (*pbVar7 >> (uVar9 & 0x1f) & 1) == 0;
          }
          if (uVar9 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar2 = uVar4 + 1;
        } while (((bool)(bVar13 & uVar2 < 0x20)) && (iVar3 = iVar6 + 1, pbVar7 < pbVar1));
        if (uVar2 == 0) {
          uVar9 = 0;
        }
        else {
          uVar10 = b->bits_left;
          pbVar7 = b->p;
          uVar9 = 0;
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar11 = 0;
            if (pbVar7 < pbVar1) {
              uVar11 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar7 = pbVar7 + 1;
              b->p = pbVar7;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar9 = uVar9 | uVar11 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar10 = -1 << ((byte)uVar2 & 0x1f);
        uVar4 = ~uVar10 + uVar9;
        uVar2 = -((int)uVar4 >> 1);
        if ((uVar4 & 1) != 0) {
          uVar2 = (int)(uVar9 - uVar10) >> 1;
        }
        pFVar8 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar8 = _stdout;
        }
        fprintf(pFVar8,"delta_scale: %d \n",(ulong)uVar2);
        uVar4 = iVar12 + 0x100 + uVar2;
        uVar9 = iVar12 + 0x1ff + uVar2;
        if (-1 < (int)uVar4) {
          uVar9 = uVar4;
        }
        iVar3 = uVar4 - (uVar9 & 0xffffff00);
        *useDefaultScalingMatrixFlag = (uint)(iVar3 == 0 && uVar5 == 0);
      }
      if (iVar3 != 0) {
        iVar12 = iVar3;
      }
      scalingList[uVar5] = iVar12;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)sizeOfScalingList);
  }
  return;
}

Assistant:

void read_debug_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 0 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); delta_scale = bs_read_se(b); printf("delta_scale: %d \n", delta_scale); 

            if( 1 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 1 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}